

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckTransformFeedbackBufferSize
          (FunctionalTest *this)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  GLint64 size;
  GLint64 local_198;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_198 = -1;
  (*this->m_pGetNamedBufferParameteri64v)(this->m_bo_out,0x8764,&local_198);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 == 0) {
    if (local_198 == -1) {
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_190 + 8),"GetNamedBufferParameteri64v has not returned a data.",
                 0x34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (local_198 == 0x1c) {
        return true;
      }
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_190 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Output buffer size is ",0x16);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", but ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," was expected.",0xe);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"GetNamedBufferParameteri64v has failed.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool FunctionalTest::CheckTransformFeedbackBufferSize()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local query storage. */
	glw::GLint64 size = -1;

	/* Querry. */
	m_pGetNamedBufferParameteri64v(m_bo_out, GL_BUFFER_SIZE, &size);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		/* Return value checking. */
		if (-1 != size)
		{
			/* Test. */
			if (sizeof(s_initial_data_b) == size)
			{
				return true;
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Output buffer size is " << size
													<< ", but " << sizeof(s_initial_data_b) << " was expected."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "GetNamedBufferParameteri64v has not returned a data."
												<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferParameteri64v has failed."
											<< tcu::TestLog::EndMessage;
	}

	return false;
}